

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
write_bignum(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,bigint *n
            )

{
  back_insert_iterator<jsoncons::binary_stream_sink> d_first;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_00;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_01;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_02;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_03;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_04;
  bool bVar1;
  back_insert_iterator<jsoncons::binary_stream_sink> bVar2;
  basic_bigint<std::allocator<unsigned_char>_> *pbVar3;
  uchar c;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range3;
  size_t length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int signum;
  bool is_neg;
  binary_stream_sink *in_stack_fffffffffffffe68;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffe70;
  back_insert_iterator<jsoncons::binary_stream_sink> in_stack_fffffffffffffe78;
  back_insert_iterator<jsoncons::binary_stream_sink> in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  uchar val_00;
  unsigned_short val;
  basic_bigint<std::allocator<unsigned_char>_> *pbVar4;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  unsigned_long in_stack_fffffffffffffe98;
  back_insert_iterator<jsoncons::binary_stream_sink> in_stack_fffffffffffffea0;
  uint64_t in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffec8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  undefined1 *local_e8;
  binary_stream_sink *local_e0;
  binary_stream_sink *local_d8;
  binary_stream_sink *local_d0;
  binary_stream_sink *local_c8;
  binary_stream_sink *local_c0;
  binary_stream_sink *local_b8;
  binary_stream_sink *local_b0;
  binary_stream_sink *local_a8;
  binary_stream_sink *local_a0;
  basic_bigint<std::allocator<unsigned_char>_> *local_98;
  undefined1 local_90 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  
  bVar1 = jsoncons::operator<((basic_bigint<std::allocator<unsigned_char>_> *)
                              in_stack_fffffffffffffea0.container,in_stack_fffffffffffffe98);
  if (bVar1) {
    basic_bigint<std::allocator<unsigned_char>_>::operator-
              ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe78.container);
    jsoncons::operator-(in_stack_fffffffffffffec8,
                        CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    basic_bigint<std::allocator<unsigned_char>_>::operator=
              ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe80.container,
               (basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe78.container);
    basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffe70);
    basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffe70);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x310539);
  basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_98 = (basic_bigint<std::allocator<unsigned_char>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
  if (bVar1) {
    write_tag((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
              CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
              in_stack_fffffffffffffeb8);
  }
  else {
    write_tag((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
              CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
              in_stack_fffffffffffffeb8);
  }
  val = (unsigned_short)((ulong)in_stack_fffffffffffffe88 >> 0x30);
  if (local_98 < (basic_bigint<std::allocator<unsigned_char>_> *)0x18) {
    local_a0 = (binary_stream_sink *)
               std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffe68);
    d_first.container._4_4_ = in_stack_fffffffffffffe94;
    d_first.container._0_4_ = in_stack_fffffffffffffe90;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((uchar)((ulong)in_stack_fffffffffffffe88 >> 0x38),d_first);
  }
  else if (local_98 < (basic_bigint<std::allocator<unsigned_char>_> *)0x100) {
    local_a8 = (binary_stream_sink *)
               std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffe68);
    val_00 = (uchar)((ulong)in_stack_fffffffffffffe88 >> 0x38);
    d_first_00.container._4_4_ = in_stack_fffffffffffffe94;
    d_first_00.container._0_4_ = in_stack_fffffffffffffe90;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (val_00,d_first_00);
    local_b0 = (binary_stream_sink *)
               std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffe68);
    d_first_01.container._4_4_ = in_stack_fffffffffffffe94;
    d_first_01.container._0_4_ = in_stack_fffffffffffffe90;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (val_00,d_first_01);
  }
  else if (local_98 < (basic_bigint<std::allocator<unsigned_char>_> *)0x10000) {
    local_b8 = (binary_stream_sink *)
               std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffe68);
    d_first_02.container._4_4_ = in_stack_fffffffffffffe94;
    d_first_02.container._0_4_ = in_stack_fffffffffffffe90;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((uchar)(val >> 8),d_first_02);
    local_c0 = (binary_stream_sink *)
               std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffe68);
    d_first_03.container._4_4_ = in_stack_fffffffffffffe94;
    d_first_03.container._0_4_ = in_stack_fffffffffffffe90;
    binary::
    native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (val,d_first_03);
  }
  else if (local_98 < (basic_bigint<std::allocator<unsigned_char>_> *)0x100000000) {
    bVar2 = std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffe68);
    d_first_04.container._4_4_ = in_stack_fffffffffffffe94;
    d_first_04.container._0_4_ = in_stack_fffffffffffffe90;
    local_c8 = bVar2.container;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((uchar)((ulong)in_stack_fffffffffffffe88 >> 0x38),d_first_04);
    local_d0 = (binary_stream_sink *)
               std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffe68);
    binary::
    native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((uint)((ulong)local_d0 >> 0x20),bVar2);
  }
  else {
    pbVar4 = local_98;
    pbVar3 = (basic_bigint<std::allocator<unsigned_char>_> *)
             std::numeric_limits<unsigned_long>::max();
    if (pbVar4 <= pbVar3) {
      in_stack_fffffffffffffe80 =
           std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffe68);
      bVar2.container._4_4_ = in_stack_fffffffffffffe94;
      bVar2.container._0_4_ = in_stack_fffffffffffffe90;
      local_d8 = in_stack_fffffffffffffe80.container;
      binary::
      native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                ((uchar)((ulong)pbVar4 >> 0x38),bVar2);
      in_stack_fffffffffffffe70 = local_98;
      in_stack_fffffffffffffe78 =
           std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffe68);
      local_e0 = in_stack_fffffffffffffe78.container;
      binary::
      native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                (in_stack_fffffffffffffe98,in_stack_fffffffffffffea0);
    }
  }
  local_e8 = local_90;
  local_f0._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffe68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_fffffffffffffe70,
                            (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_fffffffffffffe68), bVar1) {
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator*(&local_f0);
    binary_stream_sink::push_back
              (in_stack_fffffffffffffe80.container,
               (uint8_t)((ulong)in_stack_fffffffffffffe78.container >> 0x38));
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&local_f0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffe80.container);
  return;
}

Assistant:

void write_bignum(bigint& n)
    {
        bool is_neg = n < 0;
        if (is_neg)
        {
            n = - n -1;
        }

        int signum;
        std::vector<uint8_t> data;
        n.write_bytes_be(signum, data);
        std::size_t length = data.size();

        if (is_neg)
        {
            write_tag(3);
        }
        else
        {
            write_tag(2);
        }

        if (length <= 0x17)
        {
            // fixstr stores a byte array whose length is upto 31 bytes
            binary::native_to_big(static_cast<uint8_t>(0x40 + length), 
                                  std::back_inserter(sink_));
        }
        else if (length <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x58), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(length), 
                                  std::back_inserter(sink_));
        }
        else if (length <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x59), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(length), 
                                  std::back_inserter(sink_));
        }
        else if (length <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x5a), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(length), 
                                  std::back_inserter(sink_));
        }
        else if (uint64_t(length) <= (std::numeric_limits<std::uint64_t>::max)())
        {
            binary::native_to_big(static_cast<uint8_t>(0x5b), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(length), 
                                  std::back_inserter(sink_));
        }

        for (auto c : data)
        {
            sink_.push_back(c);
        }
    }